

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

int64_t __thiscall
hta::storage::file::Metric::find_index_before_or_on_binary
          (Metric *this,TimePoint t,int64_t left,int64_t right,int64_t sz)

{
  int64_t iVar1;
  ssize_t sVar2;
  long lVar3;
  long lVar4;
  RawFile *this_00;
  
  this_00 = &this->file_raw_;
  iVar1 = right;
  while( true ) {
    lVar4 = iVar1;
    if (lVar4 <= left) {
      __assert_fail("left < right",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x51,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    sVar2 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                      (this_00,(int)left,(void *)0x0,right);
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < sVar2) {
      __assert_fail("get_raw_ts(left) <= t",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x53,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    if ((lVar4 != sz) &&
       (sVar2 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                          (this_00,(int)lVar4,(void *)0x0,right),
       sVar2 <= (long)t.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r)) {
      __assert_fail("right == sz || t < get_raw_ts(right)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x54,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
                   );
    }
    if (lVar4 - left == 1) {
      return left;
    }
    lVar3 = (lVar4 + left) / 2;
    if (sz <= lVar3) break;
    sVar2 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                      (this_00,(int)lVar3,(void *)0x0,right);
    iVar1 = lVar3;
    if (sVar2 <= (long)t.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r) {
      iVar1 = lVar4;
      left = lVar3;
    }
  }
  __assert_fail("pivot < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                ,0x5a,
                "int64_t hta::storage::file::Metric::find_index_before_or_on_binary(TimePoint, int64_t, int64_t, int64_t)"
               );
}

Assistant:

int64_t Metric::find_index_before_or_on_binary(TimePoint t, int64_t left, int64_t right, int64_t sz)
{
    // left < right means right != 0
    // assumes monotonicity ts(left) < ts(right)
    // invariant ts(left) <= t < ts(right)
    // right can be size() // out of range, but the pivot can never be
    assert(left < right);
    // TODO expensive, use extra debug macro
    assert(get_raw_ts(left) <= t);
    assert(right == sz || t < get_raw_ts(right));
    if (right - left == 1)
    {
        return left;
    }
    auto pivot = (left + right) / 2;
    assert(pivot < sz);
    TimePoint t_pivot = get_raw_ts(pivot);
    if (t >= t_pivot)
    {
        return find_index_before_or_on_binary(t, pivot, right, sz);
    }
    else
    {
        return find_index_before_or_on_binary(t, left, pivot, sz);
    }
}